

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
          *enum_generators,
          vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          *extension_generators)

{
  ExtensionGenerator *in_RAX;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar1;
  Descriptor *pDVar2;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar3;
  int i_1;
  int i;
  long lVar4;
  ExtensionGenerator *local_38;
  
  local_38 = in_RAX;
  for (lVar4 = 0; pDVar2 = this->descriptor_, lVar4 < *(int *)(pDVar2 + 0x58); lVar4 = lVar4 + 1) {
    psVar1 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
             ::operator[](&this->enum_generators_,lVar4);
    local_38 = (ExtensionGenerator *)psVar1->ptr_;
    std::
    vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
    ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
              ((vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
                *)enum_generators,(EnumGenerator **)&local_38);
  }
  for (lVar4 = 0; lVar4 < *(int *)(pDVar2 + 0x78); lVar4 = lVar4 + 1) {
    psVar3 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
             ::operator[](&this->extension_generators_,lVar4);
    local_38 = psVar3->ptr_;
    std::
    vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
    ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
              ((vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
                *)extension_generators,&local_38);
    pDVar2 = this->descriptor_;
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<EnumGenerator*>* enum_generators,
    std::vector<ExtensionGenerator*>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->push_back(enum_generators_[i].get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->push_back(extension_generators_[i].get());
  }
}